

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O3

vector<slang::BufferID,_std::allocator<slang::BufferID>_> * __thiscall
slang::SourceManager::getAllBuffers
          (vector<slang::BufferID,_std::allocator<slang::BufferID>_> *__return_storage_ptr__,
          SourceManager *this)

{
  iterator __position;
  undefined8 in_RAX;
  pointer pvVar1;
  pointer pvVar2;
  ulong uVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->bufferEntries).
           super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar2 = (this->bufferEntries).
           super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (0x40 < (ulong)((long)pvVar2 - (long)pvVar1)) {
    uVar3 = 1;
    do {
      uStack_28 = CONCAT44((uint32_t)uVar3,(undefined4)uStack_28);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<slang::BufferID,_std::allocator<slang::BufferID>_>::
        _M_realloc_insert<slang::BufferID>
                  (__return_storage_ptr__,__position,(BufferID *)((long)&uStack_28 + 4));
        pvVar1 = (this->bufferEntries).
                 super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar2 = (this->bufferEntries).
                 super__Vector_base<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (__position._M_current)->id = (uint32_t)uVar3;
        (__return_storage_ptr__->
        super__Vector_base<slang::BufferID,_std::allocator<slang::BufferID>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)pvVar2 - (long)pvVar1 >> 6));
  }
  pthread_rwlock_unlock((pthread_rwlock_t *)this);
  return __return_storage_ptr__;
}

Assistant:

std::vector<BufferID> SourceManager::getAllBuffers() const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    std::vector<BufferID> result;
    for (size_t i = 1; i < bufferEntries.size(); i++)
        result.push_back(BufferID((uint32_t)i, ""sv));

    return result;
}